

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiler.cpp
# Opt level: O2

void indk::Profiler::doEmit(NeuralNet *object,int flag)

{
  _Rb_tree_iterator<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>
  _Var1;
  _Rb_tree_iterator<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>
  it;
  pair<std::_Rb_tree_iterator<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>,_std::_Rb_tree_iterator<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>_>
  pVar2;
  NeuralNet *local_20;
  
  local_20 = object;
  pVar2 = std::
          _Rb_tree<indk::NeuralNet_*,_std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>,_std::_Select1st<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>,_std::less<indk::NeuralNet_*>,_std::allocator<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>_>
          ::equal_range(&Callbacks._M_t,&local_20);
  for (_Var1 = pVar2.first._M_node; _Var1._M_node != pVar2.second._M_node._M_node;
      _Var1._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var1._M_node)) {
    if (*(int *)&_Var1._M_node[2]._M_parent == flag) {
      std::function<void_(indk::NeuralNet_*)>::operator()
                ((function<void_(indk::NeuralNet_*)> *)&_Var1._M_node[1]._M_parent,local_20);
    }
  }
  return;
}

Assistant:

void indk::Profiler::doEmit(indk::NeuralNet *object, int flag) {
    auto callback = Callbacks.equal_range(object);
    for (auto it = callback.first; it != callback.second; it++) {
        if (it->second.second == flag) it->second.first(object);
    }
}